

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_quake.cpp
# Opt level: O3

int DEarthquake::StaticGetQuakeIntensities(AActor *victim,FQuakeJiggers *jiggers)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  AActor *pAVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  DEarthquake *this;
  int iVar12;
  double dVar13;
  double dVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  TThinkerIterator<DEarthquake> iterator;
  double dStack_a0;
  FThinkerIterator local_48;
  
  if ((victim->player == (player_t *)0x0) || (iVar12 = 0, (victim->player->cheats & 1) == 0)) {
    FThinkerIterator::FThinkerIterator(&local_48,RegistrationInfo.MyClass,0x28);
    iVar12 = 0;
    this = (DEarthquake *)FThinkerIterator::Next(&local_48,false);
    if (this != (DEarthquake *)0x0) {
      iVar12 = 0;
      do {
        pAVar4 = (this->m_Spot).field_0.p;
        if (pAVar4 != (AActor *)0x0) {
          if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            dVar13 = (pAVar4->__Pos).X - (victim->__Pos).X;
            dVar14 = (pAVar4->__Pos).Y - (victim->__Pos).Y;
            dVar13 = c_sqrt(dVar14 * dVar14 + dVar13 * dVar13);
            if (dVar13 < this->m_TremorRadius) {
              iVar12 = iVar12 + 1;
              dVar13 = GetFalloff(this,dVar13);
              dVar14 = GetModIntensity(this,this->m_RollIntensity,false);
              dVar7 = GetModIntensity(this,1.0,true);
              dVar8 = GetModIntensity(this,(this->m_Intensity).X,false);
              dVar9 = GetModIntensity(this,(this->m_Intensity).Y,false);
              dVar10 = GetModIntensity(this,(this->m_Intensity).Z,false);
              uVar3 = this->m_Flags;
              if ((uVar3 & 0x20) == 0) {
                uVar15 = SUB84(dVar14,0);
                uVar16 = (undefined4)((ulong)dVar14 >> 0x20);
                dVar7 = jiggers->RollIntensity;
                if (dVar14 <= dVar7) {
                  uVar15 = SUB84(dVar7,0);
                  uVar16 = (undefined4)((ulong)dVar7 >> 0x20);
                }
                jiggers->RollIntensity = (double)CONCAT44(uVar16,uVar15) * dVar13;
                auVar17._0_8_ = dVar8 * dVar13;
                auVar17._8_8_ = dVar9 * dVar13;
                dVar10 = dVar10 * dVar13;
                if ((uVar3 & 1) == 0) {
                  auVar1._0_8_ = (jiggers->Intensity).X;
                  auVar1._8_8_ = (jiggers->Intensity).Y;
                  auVar18 = maxpd(auVar17,auVar1);
                  (jiggers->Intensity).X = (double)auVar18._0_8_;
                  (jiggers->Intensity).Y = (double)auVar18._8_8_;
                  dVar13 = (jiggers->Intensity).Z;
                  if (dVar10 <= dVar13) {
                    dVar10 = dVar13;
                  }
                  (jiggers->Intensity).Z = dVar10;
                }
                else {
                  auVar2._0_8_ = (jiggers->RelIntensity).X;
                  auVar2._8_8_ = (jiggers->RelIntensity).Y;
                  auVar18 = maxpd(auVar17,auVar2);
                  (jiggers->RelIntensity).X = (double)auVar18._0_8_;
                  (jiggers->RelIntensity).Y = (double)auVar18._8_8_;
                  dVar13 = (jiggers->RelIntensity).Z;
                  if (dVar10 <= dVar13) {
                    dVar10 = dVar13;
                  }
                  (jiggers->RelIntensity).Z = dVar10;
                }
              }
              else {
                dVar11 = FFastTrig::sin(&fasttrig,dVar10);
                jiggers->RollWave = dVar14 * dVar11 * dVar13 * dVar7;
                dVar14 = FFastTrig::sin(&fasttrig,
                                        ((double)this->m_Countdown - r_TicFracF) *
                                        (this->m_WaveSpeed).X * 0.17951958020513104 *
                                        683565275.5764316 + 6755399441055744.0);
                dVar11 = FFastTrig::sin(&fasttrig,
                                        ((double)this->m_Countdown - r_TicFracF) *
                                        (this->m_WaveSpeed).Y * 0.17951958020513104 *
                                        683565275.5764316 + 6755399441055744.0);
                auVar18._8_4_ = SUB84(dVar11 * dVar9,0);
                auVar18._0_8_ = dVar14 * dVar8;
                auVar18._12_4_ = (int)((ulong)(dVar11 * dVar9) >> 0x20);
                dVar9 = FFastTrig::sin(&fasttrig,
                                       ((double)this->m_Countdown - r_TicFracF) *
                                       (this->m_WaveSpeed).Z * 0.17951958020513104 *
                                       683565275.5764316 + 6755399441055744.0);
                dVar13 = dVar13 * dVar7;
                dStack_a0 = auVar18._8_8_;
                dVar14 = dVar13 * dVar14 * dVar8;
                dVar7 = dVar13 * dVar10 * dVar9;
                if ((this->m_Flags & 1) == 0) {
                  dVar14 = dVar14 + (jiggers->Offset).X;
                  dVar13 = dVar13 * dStack_a0 + (jiggers->Offset).Y;
                  auVar5._8_4_ = SUB84(dVar13,0);
                  auVar5._0_8_ = dVar14;
                  auVar5._12_4_ = (int)((ulong)dVar13 >> 0x20);
                  (jiggers->Offset).X = dVar14;
                  (jiggers->Offset).Y = (double)auVar5._8_8_;
                  (jiggers->Offset).Z = dVar7 + (jiggers->Offset).Z;
                }
                else {
                  dVar14 = dVar14 + (jiggers->RelOffset).X;
                  dVar13 = dVar13 * dStack_a0 + (jiggers->RelOffset).Y;
                  auVar6._8_4_ = SUB84(dVar13,0);
                  auVar6._0_8_ = dVar14;
                  auVar6._12_4_ = (int)((ulong)dVar13 >> 0x20);
                  (jiggers->RelOffset).X = dVar14;
                  (jiggers->RelOffset).Y = (double)auVar6._8_8_;
                  (jiggers->RelOffset).Z = dVar7 + (jiggers->RelOffset).Z;
                }
              }
            }
          }
          else {
            (this->m_Spot).field_0.p = (AActor *)0x0;
          }
        }
        this = (DEarthquake *)FThinkerIterator::Next(&local_48,false);
      } while (this != (DEarthquake *)0x0);
    }
  }
  return iVar12;
}

Assistant:

int DEarthquake::StaticGetQuakeIntensities(AActor *victim, FQuakeJiggers &jiggers)
{
	if (victim->player != NULL && (victim->player->cheats & CF_NOCLIP))
	{
		return 0;
	}

	TThinkerIterator<DEarthquake> iterator(STAT_EARTHQUAKE);
	DEarthquake *quake;
	int count = 0;

	while ( (quake = iterator.Next()) != nullptr)
	{
		if (quake->m_Spot != nullptr)
		{
			const double dist = quake->m_Spot->Distance2D(victim, true);
			if (dist < quake->m_TremorRadius)
			{
				++count;
				const double falloff = quake->GetFalloff(dist);
				const double r = quake->GetModIntensity(quake->m_RollIntensity);
				const double strength = quake->GetModIntensity(1.0, true);
				DVector3 intensity;
				intensity.X = quake->GetModIntensity(quake->m_Intensity.X);
				intensity.Y = quake->GetModIntensity(quake->m_Intensity.Y);
				intensity.Z = quake->GetModIntensity(quake->m_Intensity.Z);

				if (!(quake->m_Flags & QF_WAVE))
				{
					jiggers.RollIntensity = MAX(r, jiggers.RollIntensity) * falloff;

					intensity *= falloff;
					if (quake->m_Flags & QF_RELATIVE)
					{
						jiggers.RelIntensity.X = MAX(intensity.X, jiggers.RelIntensity.X);
						jiggers.RelIntensity.Y = MAX(intensity.Y, jiggers.RelIntensity.Y);
						jiggers.RelIntensity.Z = MAX(intensity.Z, jiggers.RelIntensity.Z);
					}
					else
					{
						jiggers.Intensity.X = MAX(intensity.X, jiggers.Intensity.X);
						jiggers.Intensity.Y = MAX(intensity.Y, jiggers.Intensity.Y);
						jiggers.Intensity.Z = MAX(intensity.Z, jiggers.Intensity.Z);
					}
				}
				else
				{
					jiggers.RollWave = r * quake->GetModWave(quake->m_RollWave) * falloff * strength;

					
					intensity.X *= quake->GetModWave(quake->m_WaveSpeed.X);
					intensity.Y *= quake->GetModWave(quake->m_WaveSpeed.Y);
					intensity.Z *= quake->GetModWave(quake->m_WaveSpeed.Z);
					intensity *= strength * falloff;

					// [RH] This only gives effect to the last sine quake. I would
					// prefer if some way was found to make multiples coexist
					// peacefully, but just summing them together is undesirable
					// because they could cancel each other out depending on their
					// relative phases.

					// [MC] Now does so. And they stack rather well. I'm a little
					// surprised at how easy it was.

					
					if (quake->m_Flags & QF_RELATIVE)
					{
						jiggers.RelOffset += intensity;
					}
					else
					{
						jiggers.Offset += intensity;
					}
				}
			}
		}
	}
	return count;
}